

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonProceduralExprVisitor.h
# Opt level: O3

void __thiscall
slang::analysis::NonProceduralExprVisitor::visit<slang::ast::AssertionInstanceExpression>
          (NonProceduralExprVisitor *this,AssertionInstanceExpression *expr)

{
  AnalysisContext *context;
  TimingControl *contextualClock;
  AnalyzedAssertion local_20;
  
  context = this->context;
  contextualClock = getDefaultClocking(this);
  AnalyzedAssertion::AnalyzedAssertion
            (&local_20,context,contextualClock,(AnalyzedProcedure *)0x0,this->containingSymbol,
             &expr->super_Expression);
  ast::AssertionInstanceExpression::visitExprs<slang::analysis::NonProceduralExprVisitor&>
            (expr,(AlwaysFFVisitor *)this);
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_same_v<T, CallExpression>) {
            if (ClockInference::isSampledValueFuncCall(expr)) {
                // If we don't have a default clocking active in this scope then
                // we should check the call to be sure it has an explicit clock provided.
                if (getDefaultClocking() == nullptr)
                    ClockInference::checkSampledValueFuncs(context, containingSymbol, expr);
            }
        }
        else if constexpr (std::is_same_v<T, AssertionInstanceExpression>) {
            // We might want to find a place to store these analyzed assertions created in
            // non-procedural contexts, but for now it's enough to make sure they're valid.
            AnalyzedAssertion(context, getDefaultClocking(), nullptr, containingSymbol, expr);
        }

        if constexpr (HasVisitExprs<T, NonProceduralExprVisitor>) {
            expr.visitExprs(*this);
        }
    }